

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::Array<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>::
reserve(Array<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
        *this,size_t count)

{
  Hdr *pHVar1;
  Hdr *this_00;
  size_t sVar2;
  BufHdr *pBVar3;
  bool bVar4;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  pHVar1 = (this->
           super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
           ).m_hdr;
  if (((pHVar1 == (Hdr *)0x0) || ((pHVar1->super_RefCount).m_refCount != 1)) ||
     (bVar4 = true, pHVar1->m_bufferSize < count << 3)) {
    sVar2 = getAllocSize<4096ul>(count << 3);
    pBVar3 = (BufHdr *)mem::allocate(sVar2 + 0x28);
    (pBVar3->super_RefCount).m_refCount = 0;
    (pBVar3->super_RefCount).m_weakRefCount = 1;
    (pBVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00198a88;
    pBVar3->m_bufferSize = sVar2;
    pBVar3->m_flags = 0;
    (pBVar3->super_RefCount).m_freeFunc = mem::deallocate;
    rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_38,pBVar3);
    pBVar3 = local_38.m_p;
    bVar4 = local_38.m_p != (Hdr *)0x0;
    if (bVar4) {
      pHVar1 = local_38.m_p + 1;
      sVar2 = (this->
              super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
              ).m_count;
      if (sVar2 != 0) {
        __wrap_memcpy(pHVar1,(this->
                             super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
                             ).m_p,sVar2 << 3);
      }
      this_00 = (this->
                super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
                ).m_hdr;
      if (this_00 != (Hdr *)0x0) {
        rc::RefCount::release(&this_00->super_RefCount);
        pBVar3 = local_38.m_p;
      }
      (this->
      super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
      ).m_p = (BoxListEntry<int> **)pHVar1;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      (this->
      super_ArrayRef<axl::sl::BoxListEntry<int>_*,_axl::sl::ArrayDetails<axl::sl::BoxListEntry<int>_*>_>
      ).m_hdr = pBVar3;
    }
    rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_38);
  }
  return bVar4;
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}